

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixOrtho(Matrix *__return_storage_ptr__,double left,double right,double bottom,
                    double top,double near,double far)

{
  Matrix *result;
  float fn;
  float tb;
  float rl;
  double far_local;
  double near_local;
  double top_local;
  double bottom_local;
  double right_local;
  double left_local;
  
  memset(__return_storage_ptr__,0,0x40);
  __return_storage_ptr__->m0 = 2.0 / (float)(right - left);
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m5 = 2.0 / (float)(top - bottom);
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m10 = -2.0 / (float)(far - near);
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m12 = -((float)left + (float)right) / (float)(right - left);
  __return_storage_ptr__->m13 = -((float)top + (float)bottom) / (float)(top - bottom);
  __return_storage_ptr__->m14 = -((float)far + (float)near) / (float)(far - near);
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixOrtho(double left, double right, double bottom, double top, double near, double far)
{
    Matrix result = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(far - near);

    result.m0 = 2.0f/rl;
    result.m1 = 0.0f;
    result.m2 = 0.0f;
    result.m3 = 0.0f;
    result.m4 = 0.0f;
    result.m5 = 2.0f/tb;
    result.m6 = 0.0f;
    result.m7 = 0.0f;
    result.m8 = 0.0f;
    result.m9 = 0.0f;
    result.m10 = -2.0f/fn;
    result.m11 = 0.0f;
    result.m12 = -((float)left + (float)right)/rl;
    result.m13 = -((float)top + (float)bottom)/tb;
    result.m14 = -((float)far + (float)near)/fn;
    result.m15 = 1.0f;

    return result;
}